

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void enqueue(debug_level level,string *tag,string *string)

{
  log_queue *this;
  log_entry *this_00;
  undefined1 local_30 [8];
  unique_lock<std::recursive_mutex> lock;
  string *string_local;
  string *tag_local;
  debug_level level_local;
  
  lock._8_8_ = string;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)local_30,&mutex);
  this = queue;
  if (queue != (log_queue *)0x0) {
    this_00 = (log_entry *)operator_new(0x48);
    log_queue::log_entry::log_entry(this_00,level,tag,(string *)lock._8_8_);
    log_queue::push(this,this_00);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_30);
  return;
}

Assistant:

static void enqueue(debug_level level, const std::string& tag, const std::string& string) {
    std::unique_lock<std::recursive_mutex> lock(mutex);

    if (queue) {
        queue->push(new log_queue::log_entry(level, tag, string));
    }
}